

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

nng_err http_copy_data(nni_http_entity *entity,void *data,size_t size)

{
  char *ptr;
  
  if (size == 0) {
    ptr = entity->data;
    if (entity->own == true) {
      nni_free(ptr,entity->size);
      ptr = entity->data;
    }
  }
  else {
    ptr = (char *)nni_zalloc(size);
    if (ptr == (char *)0x0) {
      return NNG_ENOMEM;
    }
    if (entity->own == true) {
      nni_free(entity->data,entity->size);
    }
    entity->data = ptr;
  }
  entity->size = size;
  entity->own = true;
  memcpy(ptr,data,size);
  return NNG_OK;
}

Assistant:

static nng_err
http_copy_data(nni_http_entity *entity, const void *data, size_t size)
{
	nng_err rv;
	if ((rv = http_alloc_data(entity, size)) == 0) {
		memcpy(entity->data, data, size);
	}
	return (rv);
}